

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

LinearSpace3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
          *this,size_t primID,BBox1f time_range)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  BBox1f BVar5;
  uint uVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  vfloat4 a0;
  float fVar15;
  float fVar18;
  float fVar19;
  vfloat4 b1;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar27 [16];
  vfloat4 a;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  vfloat4 a_1;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  
  BVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  fVar31 = BVar5.lower;
  fVar13 = BVar5.upper;
  fVar29 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  auVar17._4_4_ = fVar13;
  auVar17._0_4_ = fVar13;
  auVar17._8_4_ = fVar13;
  auVar17._12_4_ = fVar13;
  auVar16._4_12_ = auVar17._4_12_;
  auVar16._0_4_ = fVar13 - fVar31;
  fVar23 = (time_range.upper - fVar31) / auVar16._0_4_;
  fVar13 = floorf(((time_range.lower - fVar31) / auVar16._0_4_) * 1.0000002 * fVar29);
  fVar31 = 0.0;
  if (0.0 <= fVar13) {
    fVar31 = fVar13;
  }
  fVar13 = ceilf(fVar23 * 0.99999976 * fVar29);
  if (fVar29 <= fVar13) {
    fVar13 = fVar29;
  }
  if ((int)fVar13 == (int)fVar31) {
    auVar17 = rsqrtss(auVar16,0x3f800000);
    fVar29 = auVar17._0_4_;
    fVar20 = fVar29 * 1.5 - fVar29 * fVar29 * fVar29 * 0.5;
    fVar15 = fVar20 * -1.0;
    fVar18 = fVar20 * 0.0;
    fVar19 = fVar20 * 0.0;
    fVar20 = fVar20 * 0.0;
    fVar24 = fVar18 * 0.0 + fVar15 * -0.0;
    fVar28 = fVar19 * 0.0 + fVar18 * -1.0;
    fVar30 = fVar15 * 1.0 + fVar19 * -0.0;
    fVar13 = fVar20 * 0.0 + fVar20 * -0.0;
    fVar29 = fVar28 * fVar28;
    fVar31 = fVar30 * fVar30;
    fVar23 = fVar13 * fVar13;
    fVar38 = fVar31 + fVar29 + fVar24 * fVar24;
    auVar39._0_8_ = CONCAT44(fVar23 + fVar29 + fVar29,fVar38);
    auVar39._8_4_ = fVar31 + fVar29 + fVar31;
    auVar39._12_4_ = fVar23 + fVar29 + fVar23;
    auVar25._8_4_ = auVar39._8_4_;
    auVar25._0_8_ = auVar39._0_8_;
    auVar25._12_4_ = auVar39._12_4_;
    auVar17 = rsqrtss(auVar25,auVar39);
    fVar29 = auVar17._0_4_;
    fVar38 = fVar29 * 1.5 - fVar29 * fVar29 * fVar38 * 0.5 * fVar29;
    fVar28 = fVar38 * fVar28;
    fVar30 = fVar38 * fVar30;
    fVar24 = fVar38 * fVar24;
    fVar38 = fVar38 * fVar13;
    fVar29 = 0.0;
    fVar31 = 0.0;
    fVar13 = 1.0;
    fVar23 = 0.0;
  }
  else {
    iVar12 = ((int)fVar31 + (int)fVar13) / 2;
    pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices
             .items;
    uVar6 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar8 = pBVar7[iVar12].super_RawBufferView.ptr_ofs;
    sVar9 = pBVar7[iVar12].super_RawBufferView.stride;
    pfVar1 = (float *)(pcVar8 + uVar6 * sVar9);
    pfVar2 = (float *)(pcVar8 + (uVar6 + 3) * sVar9);
    fVar24 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
             maxRadiusScale;
    fVar29 = *pfVar2 - *pfVar1;
    fVar31 = pfVar2[1] - pfVar1[1];
    fVar13 = pfVar2[2] - pfVar1[2];
    fVar38 = pfVar2[3] * fVar24 - pfVar1[3] * fVar24;
    fVar23 = fVar31 * fVar31;
    fVar28 = fVar13 * fVar13;
    fVar30 = fVar38 * fVar38;
    fVar18 = fVar23 + fVar29 * fVar29 + fVar28;
    auVar35._0_8_ = CONCAT44(fVar23 + fVar23 + fVar30,fVar18);
    auVar35._8_4_ = fVar23 + fVar28 + fVar28;
    auVar35._12_4_ = fVar23 + fVar30 + fVar30;
    auVar14._8_4_ = auVar35._8_4_;
    auVar14._0_8_ = auVar35._0_8_;
    auVar14._12_4_ = auVar35._12_4_;
    auVar17 = rsqrtss(auVar14,auVar35);
    fVar23 = auVar17._0_4_;
    fVar23 = fVar23 * fVar23 * fVar18 * -0.5 * fVar23 + fVar23 * 1.5;
    fVar29 = fVar23 * fVar29;
    fVar31 = fVar23 * fVar31;
    fVar13 = fVar23 * fVar13;
    fVar23 = fVar23 * fVar38;
    if (1e-18 < fVar18) {
      pfVar3 = (float *)(pcVar8 + (uVar6 + 1) * sVar9);
      pfVar4 = (float *)(pcVar8 + (uVar6 + 2) * sVar9);
      fVar30 = (*pfVar3 * 3.0 + *pfVar4 * 0.0 + *pfVar2 * 0.0) - *pfVar1 * 3.0;
      fVar28 = (pfVar3[1] * 3.0 + pfVar4[1] * 0.0 + pfVar2[1] * 0.0) - pfVar1[1] * 3.0;
      fVar38 = (pfVar3[2] * 3.0 + pfVar4[2] * 0.0 + pfVar2[2] * 0.0) - pfVar1[2] * 3.0;
      fVar18 = (pfVar3[3] * fVar24 * 3.0 + pfVar4[3] * fVar24 * 0.0 + pfVar2[3] * fVar24 * 0.0) -
               pfVar1[3] * fVar24 * 3.0;
      fVar24 = fVar28 * fVar29 - fVar31 * fVar30;
      fVar28 = fVar38 * fVar31 - fVar13 * fVar28;
      fVar30 = fVar30 * fVar13 - fVar29 * fVar38;
      fVar38 = fVar18 * fVar23 - fVar23 * fVar18;
    }
    else {
      fVar28 = 0.0;
      fVar30 = 1.0;
      fVar24 = 0.0;
      fVar38 = 0.0;
      fVar29 = 0.0;
      fVar31 = 0.0;
      fVar13 = 1.0;
      fVar23 = 0.0;
    }
    fVar18 = fVar30 * fVar30;
    fVar20 = fVar24 * fVar24;
    fVar15 = fVar38 * fVar38;
    fVar19 = fVar18 + fVar28 * fVar28 + fVar20;
    auVar26._0_8_ = CONCAT44(fVar18 + fVar18 + fVar15,fVar19);
    auVar26._8_4_ = fVar18 + fVar20 + fVar20;
    auVar26._12_4_ = fVar18 + fVar15 + fVar15;
    if (fVar19 <= 1e-18) {
      fVar24 = -fVar31;
      fVar15 = -fVar13;
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      if (fVar24 * fVar24 + fVar13 * fVar13 + 0.0 <= fVar29 * fVar29 + fVar15 * fVar15 + 0.0) {
        auVar21 = SUB1612((undefined1  [16])0x0,0);
      }
      fVar18 = (float)((uint)fVar13 & auVar21._4_4_);
      fVar15 = (float)(~auVar21._0_4_ & (uint)fVar15);
      fVar19 = (float)(~auVar21._8_4_ & (uint)fVar29 | (uint)fVar24 & auVar21._8_4_);
      fVar24 = fVar18 * fVar18;
      fVar28 = fVar19 * fVar19;
      fVar30 = fVar24 + fVar15 * fVar15 + fVar28;
      auVar37._0_8_ = CONCAT44(fVar24 + fVar24 + 0.0,fVar30);
      auVar37._8_4_ = fVar24 + fVar28 + fVar28;
      auVar37._12_4_ = fVar24 + 0.0 + 0.0;
      auVar40._8_4_ = auVar37._8_4_;
      auVar40._0_8_ = auVar37._0_8_;
      auVar40._12_4_ = auVar37._12_4_;
      auVar17 = rsqrtss(auVar40,auVar37);
      fVar24 = auVar17._0_4_;
      fVar20 = fVar24 * 1.5 - fVar24 * fVar24 * fVar30 * 0.5 * fVar24;
      fVar15 = fVar20 * fVar15;
      fVar18 = fVar20 * fVar18;
      fVar19 = fVar20 * fVar19;
      fVar20 = fVar20 * 0.0;
      fVar24 = fVar18 * fVar29 - fVar31 * fVar15;
      fVar28 = fVar19 * fVar31 - fVar13 * fVar18;
      fVar30 = fVar15 * fVar13 - fVar29 * fVar19;
      fVar33 = fVar20 * fVar23 - fVar23 * fVar20;
      fVar38 = fVar28 * fVar28;
      fVar32 = fVar30 * fVar30;
      fVar34 = fVar33 * fVar33;
      fVar41 = fVar32 + fVar38 + fVar24 * fVar24;
      fVar42 = fVar34 + fVar38 + fVar38;
      fVar32 = fVar32 + fVar38 + fVar32;
      fVar34 = fVar34 + fVar38 + fVar34;
      auVar22._4_4_ = fVar42;
      auVar22._0_4_ = fVar41;
      auVar22._8_4_ = fVar32;
      auVar22._12_4_ = fVar34;
      auVar11._4_4_ = fVar42;
      auVar11._0_4_ = fVar41;
      auVar11._8_4_ = fVar32;
      auVar11._12_4_ = fVar34;
      auVar17 = rsqrtss(auVar22,auVar11);
      fVar38 = auVar17._0_4_;
      fVar38 = fVar38 * 1.5 - fVar38 * fVar38 * fVar41 * 0.5 * fVar38;
      fVar28 = fVar38 * fVar28;
      fVar30 = fVar38 * fVar30;
      fVar24 = fVar38 * fVar24;
      fVar38 = fVar38 * fVar33;
    }
    else {
      auVar36._8_4_ = auVar26._8_4_;
      auVar36._0_8_ = auVar26._0_8_;
      auVar36._12_4_ = auVar26._12_4_;
      auVar17 = rsqrtss(auVar36,auVar26);
      fVar18 = auVar17._0_4_;
      fVar18 = fVar18 * 1.5 - fVar18 * fVar18 * fVar19 * 0.5 * fVar18;
      fVar28 = fVar28 * fVar18;
      fVar30 = fVar30 * fVar18;
      fVar24 = fVar24 * fVar18;
      fVar38 = fVar38 * fVar18;
      fVar19 = fVar31 * fVar28 - fVar30 * fVar29;
      fVar15 = fVar13 * fVar30 - fVar24 * fVar31;
      fVar18 = fVar29 * fVar24 - fVar28 * fVar13;
      fVar33 = fVar23 * fVar38 - fVar38 * fVar23;
      fVar20 = fVar15 * fVar15;
      fVar32 = fVar18 * fVar18;
      fVar34 = fVar33 * fVar33;
      fVar41 = fVar32 + fVar20 + fVar19 * fVar19;
      fVar42 = fVar34 + fVar20 + fVar20;
      fVar32 = fVar32 + fVar20 + fVar32;
      fVar34 = fVar34 + fVar20 + fVar34;
      auVar27._4_4_ = fVar42;
      auVar27._0_4_ = fVar41;
      auVar27._8_4_ = fVar32;
      auVar27._12_4_ = fVar34;
      auVar10._4_4_ = fVar42;
      auVar10._0_4_ = fVar41;
      auVar10._8_4_ = fVar32;
      auVar10._12_4_ = fVar34;
      auVar17 = rsqrtss(auVar27,auVar10);
      fVar20 = auVar17._0_4_;
      fVar20 = fVar20 * 1.5 - fVar20 * fVar20 * fVar41 * 0.5 * fVar20;
      fVar15 = fVar20 * fVar15;
      fVar18 = fVar20 * fVar18;
      fVar19 = fVar20 * fVar19;
      fVar20 = fVar20 * fVar33;
    }
  }
  (__return_storage_ptr__->vx).field_0.m128[0] = fVar15;
  (__return_storage_ptr__->vx).field_0.m128[1] = fVar18;
  (__return_storage_ptr__->vx).field_0.m128[2] = fVar19;
  (__return_storage_ptr__->vx).field_0.m128[3] = fVar20;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar28;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar30;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar24;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar38;
  (__return_storage_ptr__->vz).field_0.m128[0] = fVar29;
  (__return_storage_ptr__->vz).field_0.m128[1] = fVar31;
  (__return_storage_ptr__->vz).field_0.m128[2] = fVar13;
  (__return_storage_ptr__->vz).field_0.m128[3] = fVar23;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }